

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.cpp
# Opt level: O1

nodeit * __thiscall N::operator[](nodeit *__return_storage_ptr__,N *this,nodeit ps_)

{
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *pCVar1;
  N **ppNVar2;
  pointer ppNVar3;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var4;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var5;
  int iVar6;
  nodeit *pnVar8;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var9;
  nodeit *pnVar10;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *pCVar11;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var12;
  nodeit local_50;
  long lVar7;
  
  _Var9._M_current = ps_._start._M_current;
  _Var12._M_current = ps_._end._M_current;
  lVar7 = (long)ps_._end._M_current - (long)ps_._start._M_current >> 3;
  iVar6 = (int)lVar7;
  pCVar11 = ps_.next;
  for (pCVar1 = ps_.next;
      pCVar1 != (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                 *)0x0; pCVar1 = pCVar1->next) {
    lVar7 = lVar7 + ((long)(pCVar1->_end)._M_current - (long)(pCVar1->_start)._M_current >> 3);
    iVar6 = (int)lVar7;
  }
  if (iVar6 == 0) {
    ppNVar3 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->_start)._M_current = ppNVar3;
    (__return_storage_ptr__->_end)._M_current = ppNVar3;
    (__return_storage_ptr__->_curr)._M_current = ppNVar3;
    __return_storage_ptr__->next =
         (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *)0x0;
  }
  else {
    operator[](__return_storage_ptr__,this,*ps_._start._M_current);
    pCVar1 = &ps_;
    do {
      pnVar10 = pCVar1;
      pCVar1 = pnVar10->next;
    } while (pCVar1 != (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                        *)0x0);
    ppNVar2 = (pnVar10->_end)._M_current;
    pnVar10 = __return_storage_ptr__;
    if (pCVar11 !=
        (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *)0x0
        || _Var9._M_current != ppNVar2) {
      do {
        pnVar8 = pnVar10;
        if (*_Var9._M_current != *ps_._start._M_current) {
          operator[](&local_50,this,*_Var9._M_current);
          _Var5._M_current = local_50._end._M_current;
          _Var4._M_current = local_50._start._M_current;
          pnVar8 = (nodeit *)::operator_new(0x20);
          (pnVar8->_start)._M_current = _Var4._M_current;
          (pnVar8->_end)._M_current = _Var5._M_current;
          (pnVar8->_curr)._M_current = _Var4._M_current;
          pnVar8->next = (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                          *)0x0;
          pnVar10->next = pnVar8;
        }
        _Var9._M_current = _Var9._M_current + 1;
        if ((pCVar11 !=
             (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *)
             0x0) && (_Var9._M_current == _Var12._M_current)) {
          _Var12._M_current = (pCVar11->_end)._M_current;
          _Var9._M_current = (pCVar11->_curr)._M_current;
          pCVar11 = pCVar11->next;
        }
        pnVar10 = pnVar8;
      } while (pCVar11 !=
               (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                *)0x0 || _Var9._M_current != ppNVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nodeit N::operator[](nodeit ps_) {
    if (ps_.size() == 0) return nodeit(os.end(), os.end());

    auto start_it = (*this)[*ps_.begin()];

    auto last = &start_it;
    for (auto p : ps_)
        if (p != *ps_.begin())
            last = last->chain((*this)[p]);

    return start_it;
}